

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O0

bool __thiscall
mjs::native_object::do_redefine_own_property
          (native_object *this,string *name,value *val,property_attribute attr)

{
  bool bVar1;
  wstring_view local_48;
  native_object_property *local_38;
  native_object_property *it;
  value *pvStack_28;
  property_attribute attr_local;
  value *val_local;
  string *name_local;
  native_object *this_local;
  
  it._4_4_ = attr;
  pvStack_28 = val;
  val_local = (value *)name;
  name_local = (string *)this;
  local_48 = string::view(name);
  local_38 = find(this,&local_48);
  if (local_38 == (native_object_property *)0x0) {
    this_local._7_1_ =
         object::do_redefine_own_property
                   (&this->super_object,(string *)val_local,pvStack_28,it._4_4_);
  }
  else {
    bVar1 = do_native_put(this,(string *)val_local,pvStack_28);
    if (bVar1) {
      local_38->attributes = it._4_4_;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool native_object::do_redefine_own_property(const string& name, const value& val, property_attribute attr) {
    if (auto it = find(name.view())) {
        if (do_native_put(name, val)) {
            it->attributes = attr;
            return true;
        }
        return false;
    }
    return object::do_redefine_own_property(name, val, attr);
}